

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O2

int hdr_init(int64_t lowest_discernible_value,int64_t highest_trackable_value,
            int significant_figures,hdr_histogram **result)

{
  int iVar1;
  int64_t *__ptr;
  hdr_histogram *h;
  hdr_histogram_bucket_config cfg;
  
  iVar1 = hdr_calculate_bucket_config
                    (lowest_discernible_value,highest_trackable_value,significant_figures,&cfg);
  if (iVar1 == 0) {
    __ptr = (int64_t *)calloc((long)cfg.counts_len,8);
    iVar1 = 0xc;
    if (__ptr != (int64_t *)0x0) {
      h = (hdr_histogram *)calloc(1,0x68);
      if (h == (hdr_histogram *)0x0) {
        free(__ptr);
      }
      else {
        h->counts = __ptr;
        hdr_init_preallocated(h,&cfg);
        *result = h;
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int hdr_init(
    int64_t lowest_discernible_value,
    int64_t highest_trackable_value,
    int significant_figures,
    struct hdr_histogram** result)
{
    int64_t* counts;
    struct hdr_histogram_bucket_config cfg;
    struct hdr_histogram* histogram;

    int r = hdr_calculate_bucket_config(lowest_discernible_value, highest_trackable_value, significant_figures, &cfg);
    if (r)
    {
        return r;
    }

    counts = (int64_t*) hdr_calloc((size_t) cfg.counts_len, sizeof(int64_t));
    if (!counts)
    {
        return ENOMEM;
    }

    histogram = (struct hdr_histogram*) hdr_calloc(1, sizeof(struct hdr_histogram));
    if (!histogram)
    {
        hdr_free(counts);
        return ENOMEM;
    }

    histogram->counts = counts;

    hdr_init_preallocated(histogram, &cfg);
    *result = histogram;

    return 0;
}